

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

IdList * sqlite3IdListAppend(Parse *pParse,IdList *pList,Token *pToken)

{
  int iVar1;
  sqlite3 *db;
  IdList *pIVar2;
  char *pPtr;
  
  db = pParse->db;
  if (pList == (IdList *)0x0) {
    pIVar2 = (IdList *)sqlite3DbMallocZero(db,0x10);
    if (pIVar2 == (IdList *)0x0) {
      return (IdList *)0x0;
    }
  }
  else {
    pIVar2 = (IdList *)sqlite3DbRealloc(db,pList,(long)pList->nId * 8 + 0x10);
    if (pIVar2 == (IdList *)0x0) {
      sqlite3IdListDelete(db,pList);
      return (IdList *)0x0;
    }
  }
  iVar1 = pIVar2->nId;
  pIVar2->nId = iVar1 + 1;
  pPtr = sqlite3NameFromToken(db,pToken);
  pIVar2->a[iVar1].zName = pPtr;
  if ((pPtr != (char *)0x0) && (1 < pParse->eParseMode)) {
    sqlite3RenameTokenMap(pParse,pPtr,pToken);
  }
  return pIVar2;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(Parse *pParse, IdList *pList, Token *pToken){
  sqlite3 *db = pParse->db;
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }else{
    IdList *pNew;
    pNew = sqlite3DbRealloc(db, pList,
                 sizeof(IdList) + pList->nId*sizeof(pList->a));
    if( pNew==0 ){
      sqlite3IdListDelete(db, pList);
      return 0;
    }
    pList = pNew;
  }
  i = pList->nId++;
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  if( IN_RENAME_OBJECT && pList->a[i].zName ){
    sqlite3RenameTokenMap(pParse, (void*)pList->a[i].zName, pToken);
  }
  return pList;
}